

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O3

int CombinedH264Reader::getPrefixLen(uint8_t *pos,uint8_t *end)

{
  if (((3 < (long)end - (long)pos) && (*pos == '\0')) && (pos[1] == '\0')) {
    if (pos[2] == '\x01') {
      return 3;
    }
    if ((pos[2] == '\0') && (pos[3] == '\x01')) {
      return 4;
    }
  }
  return 0;
}

Assistant:

int CombinedH264Reader::getPrefixLen(const uint8_t* pos, const uint8_t* end)
{
    if (end - pos < 4)
        return 0;
    if (pos[0] == 0 && pos[1] == 0)
    {
        if (pos[2] == 0 && pos[3] == 1)
            return 4;
        if (pos[2] == 1)
            return 3;
    }
    return 0;
}